

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

uint64_t __thiscall roaring::Roaring64Map::minimum(Roaring64Map *this)

{
  bool bVar1;
  uint32_t lowBytes;
  pointer ppVar2;
  uint64_t uVar3;
  unsigned_long uVar4;
  const_iterator roaring_iter;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint highBytes;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::cbegin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::cend(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_18,&local_20);
    if (!bVar1) {
      uVar4 = std::numeric_limits<unsigned_long>::max();
      return uVar4;
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x114eeb
              );
    bVar1 = Roaring::isEmpty((Roaring *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
           operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                      0x114f05);
  highBytes = ppVar2->first;
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
            ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x114f15);
  lowBytes = Roaring::minimum((Roaring *)CONCAT44(highBytes,in_stack_ffffffffffffffd0));
  uVar3 = uniteBytes(highBytes,lowBytes);
  return uVar3;
}

Assistant:

uint64_t minimum() const {
        for (auto roaring_iter = roarings.cbegin();
             roaring_iter != roarings.cend(); ++roaring_iter) {
            if (!roaring_iter->second.isEmpty()) {
                return uniteBytes(roaring_iter->first,
                                  roaring_iter->second.minimum());
            }
        }
        // we put std::numeric_limits<>::max/min in parentheses
        // to avoid a clash with the Windows.h header under Windows
        return (std::numeric_limits<uint64_t>::max)();
    }